

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_x86.h
# Opt level: O1

void aom_dc_predictor_8x32_sse2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  int iVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  auVar4 = psadbw(*(undefined1 (*) [16])left,(undefined1  [16])0x0);
  auVar5 = psadbw(*(undefined1 (*) [16])(left + 0x10),(undefined1  [16])0x0);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)above;
  auVar6 = psadbw(auVar6,(undefined1  [16])0x0);
  iVar1 = (CONCAT22(auVar6._2_2_ + auVar5._2_2_ + auVar4._2_2_ + auVar5._10_2_ + auVar4._10_2_,
                    auVar6._0_2_ + auVar5._0_2_ + auVar4._0_2_ + auVar5._8_2_ + auVar4._8_2_) +
           0x14U >> 3) * 0x3334;
  uVar3 = (undefined1)((uint)iVar1 >> 0x18);
  uVar2 = (undefined1)((uint)iVar1 >> 0x10);
  auVar4 = ZEXT416(CONCAT22(CONCAT11(uVar3,uVar3),CONCAT11(uVar2,uVar2)));
  auVar4 = pshuflw(auVar4,auVar4,0);
  iVar1 = 0x20;
  do {
    *(long *)dst = auVar4._0_8_;
    dst = dst + stride;
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  return;
}

Assistant:

static inline __m128i dc_sum_32_sse2(const uint8_t *ref) {
  __m128i x0 = _mm_load_si128((__m128i const *)ref);
  __m128i x1 = _mm_load_si128((__m128i const *)(ref + 16));
  const __m128i zero = _mm_setzero_si128();
  x0 = _mm_sad_epu8(x0, zero);
  x1 = _mm_sad_epu8(x1, zero);
  x0 = _mm_add_epi16(x0, x1);
  const __m128i high = _mm_unpackhi_epi64(x0, x0);
  return _mm_add_epi16(x0, high);
}